

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::Attribute::get<bool>
          (Attribute *this,double t,bool *dst,TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  value_type_conflict *pvVar2;
  optional<bool> v;
  undefined1 local_34 [12];
  
  if (dst == (bool *)0x0) {
    return false;
  }
  if ((NAN(t)) &&
     (local_34._4_8_ = t, bVar1 = primvar::PrimVar::has_value(&this->_var),
     t = (double)local_34._4_8_, bVar1)) {
    primvar::PrimVar::get_value<bool>((PrimVar *)local_34);
    local_34[2] = local_34[0];
    t = (double)local_34._4_8_;
    if (local_34[0] != '\0') {
      local_34[3] = local_34[1];
      pvVar2 = nonstd::optional_lite::optional<bool>::value((optional<bool> *)(local_34 + 2));
      *dst = *pvVar2;
      return true;
    }
  }
  if ((this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar1 = get_value<bool>(this,dst);
  }
  else {
    bVar1 = primvar::PrimVar::get_interpolated_value<bool>(&this->_var,t,tinterp,dst);
  }
  return bVar1;
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }